

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-specialize.inc.c
# Opt level: O0

floatx80 propagateFloatx80NaN_arm(floatx80 a,floatx80 b,float_status *status)

{
  unkuint10 Var1;
  unkuint10 Var2;
  _Bool _Var3;
  int iVar4;
  ushort uVar5;
  ulong uVar6;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  ulong uVar7;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  floatx80 a_04;
  floatx80 a_05;
  floatx80 fVar8;
  floatx80 fVar9;
  FloatClass local_4c;
  FloatClass local_48;
  bool local_41;
  FloatClass b_cls;
  FloatClass a_cls;
  flag aIsLargerSignificand;
  float_status *status_local;
  floatx80 b_local;
  floatx80 a_local;
  
  uVar6 = b.low;
  uVar7 = a.low;
  uVar5 = a.high;
  Var2 = a._0_10_;
  a_00._10_6_ = 0;
  a_00.low = (long)Var2;
  a_00.high = (short)(Var2 >> 0x40);
  iVar4 = floatx80_is_any_nan(a_00);
  if (iVar4 == 0) {
    local_48 = float_class_normal;
  }
  else {
    a_01._10_6_ = 0;
    a_01.low = (long)Var2;
    a_01.high = (short)(Var2 >> 0x40);
    iVar4 = floatx80_is_signaling_nan_arm(a_01,status);
    local_48 = float_class_qnan;
    if (iVar4 != 0) {
      local_48 = float_class_snan;
    }
  }
  Var1 = b._0_10_;
  a_02._10_6_ = 0;
  a_02.low = (long)Var1;
  a_02.high = (short)(Var1 >> 0x40);
  iVar4 = floatx80_is_any_nan(a_02);
  if (iVar4 == 0) {
    local_4c = float_class_normal;
  }
  else {
    a_03._10_6_ = 0;
    a_03.low = (long)Var1;
    a_03.high = (short)(Var1 >> 0x40);
    iVar4 = floatx80_is_signaling_nan_arm(a_03,status);
    local_4c = float_class_qnan;
    if (iVar4 != 0) {
      local_4c = float_class_snan;
    }
  }
  _Var3 = is_snan(local_48);
  if ((_Var3) || (_Var3 = is_snan(local_4c), _Var3)) {
    float_raise_arm('\x01',status);
  }
  if (status->default_nan_mode == '\0') {
    if (uVar7 < uVar6) {
      local_41 = false;
    }
    else if (uVar6 < uVar7) {
      local_41 = true;
    }
    else {
      local_41 = uVar5 < b.high;
    }
    iVar4 = pickNaN(local_48,local_4c,local_41);
    if (iVar4 == 0) {
      _Var3 = is_snan(local_48);
      if (_Var3) {
        a_05._10_6_ = 0;
        a_05.low = (long)Var2;
        a_05.high = (short)(Var2 >> 0x40);
        fVar8 = floatx80_silence_nan_arm(a_05,status);
        uVar5 = fVar8.high;
      }
      else {
        fVar8._8_8_ = extraout_RDX_00;
        fVar8.low = uVar7;
      }
    }
    else {
      _Var3 = is_snan(local_4c);
      if (_Var3) {
        a_04._10_6_ = 0;
        a_04.low = (long)Var1;
        a_04.high = (short)(Var1 >> 0x40);
        fVar8 = floatx80_silence_nan_arm(a_04,status);
        uVar5 = fVar8.high;
      }
      else {
        fVar8._8_8_ = extraout_RDX;
        fVar8.low = uVar6;
        uVar5 = b.high;
      }
    }
  }
  else {
    fVar8 = floatx80_default_nan_arm(status);
    uVar5 = fVar8.high;
  }
  a_local._8_8_ = fVar8.low;
  fVar9._10_6_ = fVar8._10_6_;
  fVar9.high = uVar5;
  fVar9.low = a_local._8_8_;
  return fVar9;
}

Assistant:

floatx80 propagateFloatx80NaN(floatx80 a, floatx80 b, float_status *status)
{
    flag aIsLargerSignificand;
    FloatClass a_cls, b_cls;

    /* This is not complete, but is good enough for pickNaN.  */
    a_cls = (!floatx80_is_any_nan(a)
             ? float_class_normal
             : floatx80_is_signaling_nan(a, status)
             ? float_class_snan
             : float_class_qnan);
    b_cls = (!floatx80_is_any_nan(b)
             ? float_class_normal
             : floatx80_is_signaling_nan(b, status)
             ? float_class_snan
             : float_class_qnan);

    if (is_snan(a_cls) || is_snan(b_cls)) {
        float_raise(float_flag_invalid, status);
    }

    if (status->default_nan_mode) {
        return floatx80_default_nan(status);
    }

    if (a.low < b.low) {
        aIsLargerSignificand = 0;
    } else if (b.low < a.low) {
        aIsLargerSignificand = 1;
    } else {
        aIsLargerSignificand = (a.high < b.high) ? 1 : 0;
    }

    if (pickNaN(a_cls, b_cls, aIsLargerSignificand)) {
        if (is_snan(b_cls)) {
            return floatx80_silence_nan(b, status);
        }
        return b;
    } else {
        if (is_snan(a_cls)) {
            return floatx80_silence_nan(a, status);
        }
        return a;
    }
}